

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic1::Run(UnitTest_semantic1 *this)

{
  Terminator *pTVar1;
  Terminator *pTVar2;
  Terminator *pTVar3;
  Terminator *pTVar4;
  allocator local_71;
  string local_70;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_50;
  allocator local_48 [32];
  
  std::__cxx11::string::string((string *)&local_70,"a, b = c, d",local_48);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)local_48,"a",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string((string *)local_48,"b",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string((string *)local_48,"c",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string((string *)local_48,"d",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  pTVar4 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  if (pTVar1->semantic_ != SemanticOp_Write) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'a->semantic_ == luna::SemanticOp_Write\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pTVar2->semantic_ != SemanticOp_Write) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'b->semantic_ == luna::SemanticOp_Write\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pTVar3->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'c->semantic_ == luna::SemanticOp_Read\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pTVar4->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'d->semantic_ == luna::SemanticOp_Read\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (local_50._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_50._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic1)
{
    auto ast = Semantic("a, b = c, d");
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    auto c = ASTFind<luna::Terminator>(ast, FindName("c"));
    auto d = ASTFind<luna::Terminator>(ast, FindName("d"));
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(c->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(d->semantic_ == luna::SemanticOp_Read);
}